

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

uintptr_t virt_to_phys(void *virt)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  __off_t _Var4;
  ssize_t sVar5;
  undefined8 extraout_RAX;
  long *plVar6;
  uintptr_t *puVar7;
  undefined8 extraout_RAX_00;
  ulong extraout_RDX;
  long lVar8;
  ulong *__buf;
  long *plVar9;
  uintptr_t uVar10;
  uint uVar11;
  uintptr_t *virt_00;
  int iVar12;
  ulong uVar13;
  dma_memory dVar14;
  uintptr_t phy;
  char buf [512];
  undefined8 uVar15;
  void *pvVar16;
  ulong local_230 [66];
  
  uVar3 = sysconf(0x1e);
  __buf = (ulong *)0x0;
  iVar2 = open("/proc/self/pagemap",0);
  if (iVar2 == -1) {
    virt_to_phys_cold_4();
LAB_00104e5a:
    virt_to_phys_cold_3();
  }
  else {
    __buf = (ulong *)(((ulong)virt / uVar3) * 8);
    _Var4 = lseek(iVar2,(__off_t)__buf,0);
    if (_Var4 == -1) goto LAB_00104e5a;
    __buf = local_230;
    local_230[0] = 0;
    sVar5 = read(iVar2,__buf,8);
    if (sVar5 != -1) {
      close(iVar2);
      if (local_230[0] != 0) {
        return (ulong)virt % uVar3 + (local_230[0] & 0x7fffffffffffff) * uVar3;
      }
      goto LAB_00104e6e;
    }
  }
  virt_to_phys_cold_2();
LAB_00104e6e:
  plVar9 = (long *)virt;
  virt_to_phys_cold_1();
  uVar13 = 0x800;
  if ((int)__buf != 0) {
    uVar13 = (ulong)__buf & 0xffffffff;
  }
  if ((VFIO_CONTAINER_FILE_DESCRIPTOR == -1) && ((int)(0x200000 % uVar13) != 0)) {
    uVar15 = extraout_RAX;
    pvVar16 = virt;
    memory_allocate_mempool_cold_1();
    uVar11 = *(uint *)(plVar9 + 2);
    uVar10 = extraout_RDX & 0xffffffff;
    uVar13 = (ulong)uVar11;
    if (uVar11 < (uint)extraout_RDX) {
      fprintf(_stderr,"[WARN ] %s:%d %s(): memory pool %p only has %d free bufs, requested %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x7d,
              "pkt_buf_alloc_batch",plVar9,(ulong)uVar11,uVar10,extraout_RAX_00,virt,uVar3,uVar15,
              pvVar16);
      uVar10 = (uintptr_t)*(uint *)(plVar9 + 2);
      uVar13 = uVar10;
    }
    if ((int)uVar10 != 0) {
      lVar1 = plVar9[1];
      lVar8 = 0;
      do {
        uVar11 = (int)uVar13 - 1;
        uVar13 = (ulong)uVar11;
        *(ulong *)((long)__buf + lVar8) =
             (ulong)(uint)(*(int *)((long)plVar9 + uVar13 * 4 + 0x14) * (int)lVar1) + *plVar9;
        lVar8 = lVar8 + 8;
      } while (uVar10 << 3 != lVar8);
      *(uint *)(plVar9 + 2) = uVar11;
    }
    return uVar10;
  }
  iVar2 = (int)plVar9;
  plVar6 = (long *)malloc(((ulong)plVar9 & 0xffffffff) * 4 + 0x18);
  iVar12 = (int)uVar13;
  uVar11 = 0;
  dVar14 = memory_allocate_dma((ulong)(uint)(iVar12 * iVar2),false);
  *(int *)((long)plVar6 + 0xc) = iVar2;
  *(int *)(plVar6 + 1) = iVar12;
  *plVar6 = (long)dVar14.virt;
  *(int *)(plVar6 + 2) = iVar2;
  if (iVar2 != 0) {
    uVar3 = 0;
    do {
      *(int *)((long)plVar6 + uVar3 * 4 + 0x14) = (int)uVar3;
      virt_00 = (uintptr_t *)((ulong)uVar11 + *plVar6);
      puVar7 = virt_00;
      if (VFIO_CONTAINER_FILE_DESCRIPTOR == -1) {
        puVar7 = (uintptr_t *)virt_to_phys(virt_00);
      }
      *virt_00 = (uintptr_t)puVar7;
      *(int *)(virt_00 + 2) = (int)uVar3;
      uVar3 = uVar3 + 1;
      uVar11 = uVar11 + iVar12;
      virt_00[1] = (uintptr_t)plVar6;
      *(undefined4 *)((long)virt_00 + 0x14) = 0;
    } while (((ulong)plVar9 & 0xffffffff) != uVar3);
  }
  return (uintptr_t)plVar6;
}

Assistant:

static uintptr_t virt_to_phys(void* virt) {
	long pagesize = sysconf(_SC_PAGESIZE);
	int fd = check_err(open("/proc/self/pagemap", O_RDONLY), "getting pagemap");
	// pagemap is an array of pointers for each normal-sized page
	check_err(lseek(fd, (uintptr_t) virt / pagesize * sizeof(uintptr_t), SEEK_SET), "getting pagemap");
	uintptr_t phy = 0;
	check_err(read(fd, &phy, sizeof(phy)), "translating address");
	close(fd);
	if (!phy) {
		error("failed to translate virtual address %p to physical address", virt);
	}
	// bits 0-54 are the page number
	return (phy & 0x7fffffffffffffULL) * pagesize + ((uintptr_t) virt) % pagesize;
}